

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t spvtools::val::FirstBlockAssert(ValidationState_t *_,uint32_t target)

{
  ValidationState_t *pVVar1;
  bool bVar2;
  uint32_t uVar3;
  Function *pFVar4;
  Instruction *inst;
  DiagnosticStream *pDVar5;
  BasicBlock *this;
  string local_258;
  string local_238;
  string local_218;
  DiagnosticStream local_1f8;
  uint32_t local_1c;
  ValidationState_t *pVStack_18;
  uint32_t target_local;
  ValidationState_t *__local;
  
  local_1c = target;
  pVStack_18 = _;
  pFVar4 = ValidationState_t::current_function(_);
  bVar2 = Function::IsFirstBlock(pFVar4,local_1c);
  pVVar1 = pVStack_18;
  if (bVar2) {
    pFVar4 = ValidationState_t::current_function(pVStack_18);
    uVar3 = Function::id(pFVar4);
    inst = ValidationState_t::FindDef(pVVar1,uVar3);
    ValidationState_t::diag(&local_1f8,pVVar1,SPV_ERROR_INVALID_CFG,inst);
    pDVar5 = DiagnosticStream::operator<<(&local_1f8,(char (*) [13])"First block ");
    ValidationState_t::getIdName_abi_cxx11_(&local_218,pVStack_18,local_1c);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_218);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [14])" of function ");
    pVVar1 = pVStack_18;
    pFVar4 = ValidationState_t::current_function(pVStack_18);
    uVar3 = Function::id(pFVar4);
    ValidationState_t::getIdName_abi_cxx11_(&local_238,pVVar1,uVar3);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_238);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [23])" is targeted by block ");
    pVVar1 = pVStack_18;
    pFVar4 = ValidationState_t::current_function(pVStack_18);
    this = Function::current_block(pFVar4);
    uVar3 = BasicBlock::id(this);
    ValidationState_t::getIdName_abi_cxx11_(&local_258,pVVar1,uVar3);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_258);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  else {
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t FirstBlockAssert(ValidationState_t& _, uint32_t target) {
  if (_.current_function().IsFirstBlock(target)) {
    return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(_.current_function().id()))
           << "First block " << _.getIdName(target) << " of function "
           << _.getIdName(_.current_function().id()) << " is targeted by block "
           << _.getIdName(_.current_function().current_block()->id());
  }
  return SPV_SUCCESS;
}